

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t set_timefilter(archive_match *a,wchar_t timetype,time_t mtime_sec,long mtime_nsec,
                      time_t ctime_sec,long ctime_nsec)

{
  wchar_t in_EAX;
  bool bVar1;
  
  if (((uint)timetype >> 8 & 1) != 0) {
    if ((timetype & 1U) != 0 || (timetype & 0x12U) == 0x10) {
      a->newer_mtime_filter = timetype;
      a->newer_mtime_sec = mtime_sec;
      a->newer_mtime_nsec = mtime_nsec;
      *(byte *)&a->setflag = (byte)a->setflag | 2;
    }
    bVar1 = (timetype & 2U) == 0;
    in_EAX = CONCAT31((int3)((uint)in_EAX >> 8),bVar1);
    if (!bVar1 || (timetype & 0x11U) == 0x10) {
      a->older_mtime_filter = timetype;
      a->older_mtime_sec = mtime_sec;
      a->older_mtime_nsec = mtime_nsec;
      *(byte *)&a->setflag = (byte)a->setflag | 2;
    }
  }
  if (((uint)timetype >> 9 & 1) != 0) {
    if ((timetype & 1U) != 0 || (timetype & 0x12U) == 0x10) {
      a->newer_ctime_filter = timetype;
      a->newer_ctime_sec = ctime_sec;
      a->newer_ctime_nsec = ctime_nsec;
      *(byte *)&a->setflag = (byte)a->setflag | 2;
    }
    bVar1 = (timetype & 2U) == 0;
    in_EAX = CONCAT31((int3)((uint)in_EAX >> 8),bVar1);
    if (!bVar1 || (timetype & 0x11U) == 0x10) {
      a->older_ctime_filter = timetype;
      a->older_ctime_sec = ctime_sec;
      a->older_ctime_nsec = ctime_nsec;
      *(byte *)&a->setflag = (byte)a->setflag | 2;
    }
  }
  return in_EAX;
}

Assistant:

static int
set_timefilter(struct archive_match *a, int timetype,
    time_t mtime_sec, long mtime_nsec, time_t ctime_sec, long ctime_nsec)
{
	if (timetype & ARCHIVE_MATCH_MTIME) {
		if ((timetype & ARCHIVE_MATCH_NEWER) || JUST_EQUAL(timetype)) {
			a->newer_mtime_filter = timetype;
			a->newer_mtime_sec = mtime_sec;
			a->newer_mtime_nsec = mtime_nsec;
			a->setflag |= TIME_IS_SET;
		}
		if ((timetype & ARCHIVE_MATCH_OLDER) || JUST_EQUAL(timetype)) {
			a->older_mtime_filter = timetype;
			a->older_mtime_sec = mtime_sec;
			a->older_mtime_nsec = mtime_nsec;
			a->setflag |= TIME_IS_SET;
		}
	}
	if (timetype & ARCHIVE_MATCH_CTIME) {
		if ((timetype & ARCHIVE_MATCH_NEWER) || JUST_EQUAL(timetype)) {
			a->newer_ctime_filter = timetype;
			a->newer_ctime_sec = ctime_sec;
			a->newer_ctime_nsec = ctime_nsec;
			a->setflag |= TIME_IS_SET;
		}
		if ((timetype & ARCHIVE_MATCH_OLDER) || JUST_EQUAL(timetype)) {
			a->older_ctime_filter = timetype;
			a->older_ctime_sec = ctime_sec;
			a->older_ctime_nsec = ctime_nsec;
			a->setflag |= TIME_IS_SET;
		}
	}
	return (ARCHIVE_OK);
}